

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::
        create<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block>(void)

{
  Block *pBVar1;
  void *p;
  Block *in_stack_fffffffffffffff0;
  
  pBVar1 = (Block *)ConcurrentQueueDefaultTraits::malloc(0x830);
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = (Block *)0x0;
  }
  else {
    ConcurrentQueue<_zframe_t_*,_MyTraits>::Block::Block(in_stack_fffffffffffffff0);
  }
  return pBVar1;
}

Assistant:

static inline U* create()
	{
		auto p = (Traits::malloc)(sizeof(U));
		return p != nullptr ? new (p) U : nullptr;
	}